

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

Blob * __thiscall
jbcoin::STObject::getFieldVL(Blob *__return_storage_ptr__,STObject *this,SField *field)

{
  _Head_base<0UL,_unsigned_char_*,_false> __first;
  STBlob *pSVar1;
  allocator_type local_31;
  STBlob local_30;
  
  local_30.super_STBase.fName = (SField *)sfGeneric;
  local_30.super_STBase._vptr_STBase = (_func_int **)&PTR__STBlob_002d30a8;
  local_30.value_.p_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  local_30.value_.size_ = 0;
  pSVar1 = getFieldByConstRef<jbcoin::STBlob,jbcoin::STBlob>(this,field,&local_30);
  __first._M_head_impl =
       (pSVar1->value_).p_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             __first._M_head_impl,__first._M_head_impl + (pSVar1->value_).size_,&local_31);
  local_30.super_STBase._vptr_STBase = (_func_int **)&PTR__STBlob_002d30a8;
  if ((_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
      local_30.value_.p_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    operator_delete__((void *)local_30.value_.p_._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

Blob STObject::getFieldVL (SField const& field) const
{
    STBlob empty;
    STBlob const& b = getFieldByConstRef <STBlob> (field, empty);
    return Blob (b.data (), b.data () + b.size ());
}